

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

Vec_Ptr_t * Aig_Support(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Vec_Ptr_t *vSupp;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                  ,0x351,"Vec_Ptr_t *Aig_Support(Aig_Man_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) != 3) {
    Aig_ManIncrementTravId(p);
    vSupp = Vec_PtrAlloc(100);
    Aig_Support_rec(p,pObj,vSupp);
    return vSupp;
  }
  __assert_fail("!Aig_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                ,0x352,"Vec_Ptr_t *Aig_Support(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

Vec_Ptr_t * Aig_Support( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vSupp;
    assert( !Aig_IsComplement(pObj) );
    assert( !Aig_ObjIsCo(pObj) );
    Aig_ManIncrementTravId( p );
    vSupp = Vec_PtrAlloc( 100 );
    Aig_Support_rec( p, pObj, vSupp );
    return vSupp;
}